

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-grammar.cpp
# Opt level: O1

void __thiscall llama_grammar_parser::print(llama_grammar_parser *this,FILE *file)

{
  _Rb_tree_header *p_Var1;
  pointer pvVar2;
  pointer plVar3;
  long lVar4;
  mapped_type *pmVar5;
  _Base_ptr p_Var6;
  long lVar7;
  long *plVar8;
  runtime_error *prVar9;
  size_type *psVar10;
  long lVar11;
  int __c;
  unsigned_long __val;
  llama_grammar_element elem;
  map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  symbol_id_names;
  uint local_11c;
  undefined8 local_118;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  llama_grammar_parser *local_d0;
  string local_c8;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  long local_68;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var6 = (this->symbol_ids)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->symbol_ids)._M_t._M_impl.super__Rb_tree_header;
  local_d0 = this;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)p_Var6 != p_Var1) {
    do {
      pmVar5 = std::
               map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&local_60,&p_Var6[2]._M_color);
      std::__cxx11::string::_M_assign((string *)pmVar5);
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != p_Var1);
  }
  lVar7 = (long)(local_d0->rules).
                super__Vector_base<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>,_std::allocator<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(local_d0->rules).
                super__Vector_base<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>,_std::allocator<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (lVar7 != 0) {
    local_68 = (lVar7 >> 3) * -0x5555555555555555;
    local_68 = local_68 + (ulong)(local_68 == 0);
    lVar7 = 0;
    do {
      pvVar2 = (local_d0->rules).
               super__Vector_base<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>,_std::allocator<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_11c = (uint)lVar7;
      plVar3 = *(pointer *)
                ((long)&pvVar2[lVar7].
                        super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>
                        ._M_impl.super__Vector_impl_data + 8);
      if ((pvVar2[lVar7].
           super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>._M_impl
           .super__Vector_impl_data._M_start == plVar3) || (plVar3[-1].type != LLAMA_GRETYPE_END)) {
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::to_string(&local_110,local_11c);
        std::operator+(&local_f0,"malformed rule, does not end with LLAMA_GRETYPE_END: ",&local_110)
        ;
        std::runtime_error::runtime_error(prVar9,(string *)&local_f0);
        __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pmVar5 = std::
               map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::at((map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&local_60,&local_11c);
      pvVar2 = pvVar2 + lVar7;
      fprintf((FILE *)file,"%s ::= ",(pmVar5->_M_dataplus)._M_p);
      lVar11 = (long)*(pointer *)
                      ((long)&(pvVar2->
                              super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>
                              )._M_impl.super__Vector_impl_data + 8) -
               *(long *)&(pvVar2->
                         super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>
                         )._M_impl.super__Vector_impl_data >> 3;
      if (lVar11 != 1) {
        __val = 0;
        do {
          lVar4 = *(long *)&(pvVar2->
                            super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>
                            )._M_impl.super__Vector_impl_data;
          local_118 = *(ulong *)(lVar4 + __val * 8);
          switch(local_118 & 0xffffffff) {
          case 0:
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::to_string(&local_a8,local_11c);
            std::operator+(&local_88,"unexpected end of rule: ",&local_a8);
            plVar8 = (long *)std::__cxx11::string::append((char *)&local_88);
            local_110._M_dataplus._M_p = (pointer)*plVar8;
            psVar10 = (size_type *)(plVar8 + 2);
            if ((size_type *)local_110._M_dataplus._M_p == psVar10) {
              local_110.field_2._M_allocated_capacity = *psVar10;
              local_110.field_2._8_8_ = plVar8[3];
              local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
            }
            else {
              local_110.field_2._M_allocated_capacity = *psVar10;
            }
            local_110._M_string_length = plVar8[1];
            *plVar8 = (long)psVar10;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            std::__cxx11::to_string(&local_c8,__val);
            std::operator+(&local_f0,&local_110,&local_c8);
            std::runtime_error::runtime_error(prVar9,(string *)&local_f0);
            __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          case 1:
            fwrite("| ",2,1,(FILE *)file);
            break;
          case 2:
            pmVar5 = std::
                     map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::at((map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&local_60,(key_type_conflict *)((long)&local_118 + 4));
            fprintf((FILE *)file,"%s ",(pmVar5->_M_dataplus)._M_p);
            break;
          case 3:
            __c = 0x5b;
            goto LAB_0019597b;
          case 4:
            fwrite("[^",2,1,(FILE *)file);
            goto LAB_001959c7;
          case 5:
            if ((__val == 0) || (4 < *(int *)(lVar4 + -8 + __val * 8) - 3U)) {
              prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::__cxx11::to_string(&local_a8,local_11c);
              std::operator+(&local_88,"LLAMA_GRETYPE_CHAR_RNG_UPPER without preceding char: ",
                             &local_a8);
              plVar8 = (long *)std::__cxx11::string::append((char *)&local_88);
              local_110._M_dataplus._M_p = (pointer)*plVar8;
              psVar10 = (size_type *)(plVar8 + 2);
              if ((size_type *)local_110._M_dataplus._M_p == psVar10) {
                local_110.field_2._M_allocated_capacity = *psVar10;
                local_110.field_2._8_8_ = plVar8[3];
                local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
              }
              else {
                local_110.field_2._M_allocated_capacity = *psVar10;
              }
              local_110._M_string_length = plVar8[1];
              *plVar8 = (long)psVar10;
              plVar8[1] = 0;
              *(undefined1 *)(plVar8 + 2) = 0;
              std::__cxx11::to_string(&local_c8,__val);
              std::operator+(&local_f0,&local_110,&local_c8);
              std::runtime_error::runtime_error(prVar9,(string *)&local_f0);
              __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            __c = 0x2d;
LAB_0019597b:
            fputc(__c,(FILE *)file);
            goto LAB_001959c7;
          case 6:
            if ((__val == 0) || (4 < *(int *)(lVar4 + -8 + __val * 8) - 3U)) {
              prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::__cxx11::to_string(&local_a8,local_11c);
              std::operator+(&local_88,"LLAMA_GRETYPE_CHAR_ALT without preceding char: ",&local_a8);
              plVar8 = (long *)std::__cxx11::string::append((char *)&local_88);
              local_110._M_dataplus._M_p = (pointer)*plVar8;
              psVar10 = (size_type *)(plVar8 + 2);
              if ((size_type *)local_110._M_dataplus._M_p == psVar10) {
                local_110.field_2._M_allocated_capacity = *psVar10;
                local_110.field_2._8_8_ = plVar8[3];
                local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
              }
              else {
                local_110.field_2._M_allocated_capacity = *psVar10;
              }
              local_110._M_string_length = plVar8[1];
              *plVar8 = (long)psVar10;
              plVar8[1] = 0;
              *(undefined1 *)(plVar8 + 2) = 0;
              std::__cxx11::to_string(&local_c8,__val);
              std::operator+(&local_f0,&local_110,&local_c8);
              std::runtime_error::runtime_error(prVar9,(string *)&local_f0);
              __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
LAB_001959c7:
            print_grammar_char(file,local_118._4_4_);
            break;
          case 7:
            fputc(0x2e,(FILE *)file);
          }
          if (((int)local_118 - 3U < 5) &&
             (2 < *(int *)(*(long *)&(pvVar2->
                                     super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>
                                     )._M_impl.super__Vector_impl_data + 8 + __val * 8) - 5U)) {
            fwrite("] ",2,1,(FILE *)file);
          }
          __val = __val + 1;
        } while (lVar11 - 1U != __val);
      }
      fputc(10,(FILE *)file);
      lVar7 = lVar7 + 1;
    } while (lVar7 != local_68);
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void llama_grammar_parser::print(FILE * file) {
    try {
        std::map<uint32_t, std::string> symbol_id_names;
        for (const auto & kv : symbol_ids) {
            symbol_id_names[kv.second] = kv.first;
        }
        for (size_t i = 0, end = rules.size(); i < end; i++) {
            // fprintf(file, "%zu: ", i);
            // print_rule_binary(file, rules[i]);
            print_rule(file, uint32_t(i), rules[i], symbol_id_names);
            // fprintf(file, "\n");
        }
    } catch (const std::exception & err) {
        fprintf(stderr, "\n%s: error printing grammar: %s\n", __func__, err.what());
    }
}